

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGeneric<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  ValidityMask *in_RCX;
  ValidityMask *in_RDX;
  ValidityMask *in_RSI;
  uhugeint_t *result_data;
  UnifiedVectorFormat rdata;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat *this;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffee8;
  VectorType vector_type_p;
  Vector *in_stack_fffffffffffffef0;
  UnifiedVectorFormat local_c8;
  UnifiedVectorFormat *in_stack_ffffffffffffff80;
  data_ptr_t in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  element_type *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  SelectionVector *in_stack_ffffffffffffffa8;
  uhugeint_t *in_stack_ffffffffffffffb0;
  uhugeint_t *in_stack_ffffffffffffffb8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffee8 >> 0x38);
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  UnifiedVectorFormat::UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Vector::ToUnifiedFormat
            ((Vector *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (idx_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Vector::ToUnifiedFormat
            ((Vector *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (idx_t)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Vector::SetVectorType(in_stack_fffffffffffffef0,vector_type_p);
  FlatVector::GetData<duckdb::uhugeint_t>((Vector *)0x132250d);
  UnifiedVectorFormat::GetData<duckdb::uhugeint_t>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
  UnifiedVectorFormat::GetData<duckdb::uhugeint_t>(&local_c8);
  this = (UnifiedVectorFormat *)&local_c8.validity;
  FlatVector::Validity((Vector *)0x132258e);
  ExecuteGenericLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperatorOverflowCheck,bool>
            ((uhugeint_t *)in_stack_ffffffffffffffc0._M_pi,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (SelectionVector *)in_stack_ffffffffffffffa0._M_pi,(idx_t)in_stack_ffffffffffffff98,
             in_RCX,in_RDX,in_RSI,(bool)in_stack_ffffffffffffff97);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  UnifiedVectorFormat::~UnifiedVectorFormat(this);
  return;
}

Assistant:

static void ExecuteGeneric(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		UnifiedVectorFormat ldata, rdata;

		left.ToUnifiedFormat(count, ldata);
		right.ToUnifiedFormat(count, rdata);

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		ExecuteGenericLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC>(
		    UnifiedVectorFormat::GetData<LEFT_TYPE>(ldata), UnifiedVectorFormat::GetData<RIGHT_TYPE>(rdata),
		    result_data, ldata.sel, rdata.sel, count, ldata.validity, rdata.validity, FlatVector::Validity(result),
		    fun);
	}